

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O3

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
ColorTracker::getMaxAreaContour
          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__return_storage_ptr__,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *contours)

{
  pointer pvVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double *pdVar4;
  runtime_error *this;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pPVar8;
  long *plVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  pointer pvVar13;
  double dVar14;
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> area;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> contour;
  vector<double,_std::allocator<double>_> local_188;
  long lStack_170;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_160;
  runtime_error *local_158;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_150;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar13 = (contours->
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (contours->
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_160 = contours;
  local_158 = (runtime_error *)__return_storage_ptr__;
  if (pvVar13 == pvVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
               ,"");
    std::operator+(&local_70,"in ",&local_b0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    auVar2._8_8_ = &local_f0.field_2;
    auVar2._0_8_ = plVar6;
    auVar15._8_8_ = (size_type *)*plVar6;
    auVar15._0_8_ = plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      local_f0.field_2._M_allocated_capacity = *psVar7;
      local_f0.field_2._8_8_ = plVar6[3];
      goto LAB_001121b4;
    }
  }
  else {
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    do {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_150,pvVar13);
      local_110.field_2._M_allocated_capacity = 0;
      local_110._M_dataplus._M_p._0_4_ = 0x8103000c;
      local_110._M_string_length = (size_type)&local_150;
      local_130._M_dataplus._M_p = (pointer)cv::contourArea((_InputArray *)&local_110,false);
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_188,
                   (iterator)
                   local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_130);
      }
      else {
        *local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_130._M_dataplus._M_p;
        local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      this = local_158;
      pvVar13 = pvVar13 + 1;
    } while (pvVar13 != pvVar1);
    pdVar10 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    pdVar11 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pdVar10 !=
        local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish &&
        local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar14 = *local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        dVar3 = *pdVar10;
        pdVar4 = pdVar10;
        if (*pdVar10 <= dVar14) {
          dVar3 = dVar14;
          pdVar4 = pdVar11;
        }
        pdVar11 = pdVar4;
        dVar14 = dVar3;
        pdVar10 = pdVar10 + 1;
      } while (pdVar10 !=
               local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    uVar12 = (long)pdVar11 -
             (long)local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    pvVar13 = (local_160->
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar7 = (size_type *)
             ((long)(local_160->
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3);
    if (uVar12 <= (ulong)((long)psVar7 * -0x5555555555555555) &&
        (long)psVar7 * -0x5555555555555555 - uVar12 != 0) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_158,
                 pvVar13 + uVar12);
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this;
    }
    auVar15 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
  }
  local_f0.field_2._M_allocated_capacity = *psVar7;
  auVar2 = auVar15;
LAB_001121b4:
  local_f0._M_dataplus._M_p = auVar2._8_8_;
  puVar5 = auVar2._0_8_;
  local_f0._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::to_string(&local_90,0x110);
  std::operator+(&local_50,&local_f0,&local_90);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_130._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar7) {
    local_130.field_2._M_allocated_capacity = *psVar7;
    local_130.field_2._8_8_ = plVar6[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar7;
  }
  local_130._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"getMaxAreaContour","");
  std::operator+(&local_110,&local_130,&local_d0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*plVar6;
  pPVar8 = (pointer)(plVar6 + 2);
  if (local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start == pPVar8) {
    local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar8;
    lStack_138 = plVar6[3];
    local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar8;
  }
  local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar6[1];
  *plVar6 = (long)pPVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)*plVar6;
  plVar9 = plVar6 + 2;
  if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)plVar9) {
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar9;
    lStack_170 = plVar6[3];
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar9;
  }
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_188);
  *(undefined ***)this = &PTR__runtime_error_0011d9d8;
  __cxa_throw(this,&ProcessingException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

vector<Point> ColorTracker::getMaxAreaContour(const vector<vector<Point>>& contours) noexcept(false){
    if(contours.empty()){
        //cout << "given contours list length is 0" << endl;
        throw ProcessingException(WHERE + "invalid input: given contours list length is 0");
    }
    
    vector<double> area;
    for(vector<Point> contour : contours){
        area.push_back(cv::contourArea(contour));
    }

    auto maxIter = std::max_element(area.begin(),area.end());
    auto maxIndex = std::distance(area.begin(),maxIter);

    return contours.at(maxIndex);
}